

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O2

void PrepareMapToPalette(uint32_t *palette,uint32_t num_colors,uint32_t *sorted,uint32_t *idx_map)

{
  int iVar1;
  ulong __nmemb;
  ulong uVar2;
  
  __nmemb = (ulong)num_colors;
  memcpy(sorted,palette,__nmemb * 4);
  qsort(sorted,__nmemb,4,PaletteCompareColorsForQsort);
  for (uVar2 = 0; __nmemb != uVar2; uVar2 = uVar2 + 1) {
    iVar1 = SearchColorNoIdx(sorted,palette[uVar2],num_colors);
    idx_map[iVar1] = (uint32_t)uVar2;
  }
  return;
}

Assistant:

void PrepareMapToPalette(const uint32_t palette[], uint32_t num_colors,
                         uint32_t sorted[], uint32_t idx_map[]) {
  uint32_t i;
  memcpy(sorted, palette, num_colors * sizeof(*sorted));
  qsort(sorted, num_colors, sizeof(*sorted), PaletteCompareColorsForQsort);
  for (i = 0; i < num_colors; ++i) {
    idx_map[SearchColorNoIdx(sorted, palette[i], num_colors)] = i;
  }
}